

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O2

void vkt::shaderexecutor::generateSources
               (ShaderType shaderType,ShaderSpec *shaderSpec,SourceCollections *dst)

{
  vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *pvVar1;
  int iVar2;
  DataType DVar3;
  ProgramSources *pPVar4;
  ostream *poVar5;
  istream *piVar6;
  char *pcVar7;
  InternalError *this;
  uint *inputPrefix;
  vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *inputs;
  vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *inputs_00;
  int ndx;
  int iVar8;
  pointer pSVar9;
  FragmentOutputLayout *this_00;
  string *this_01;
  string *in_R8;
  string *in_R9;
  VarType *pVVar10;
  allocator<char> local_472;
  allocator<char> local_471;
  ProgramSources *local_470;
  allocator<char> local_461;
  undefined1 local_460 [40];
  string line;
  FragmentOutputLayout outputLayout;
  string local_3c8;
  undefined1 local_3a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  ProgramSources *local_368;
  string local_360;
  VarType intType;
  istringstream opSrc;
  string local_320 [376];
  ostringstream src;
  string local_1a0 [368];
  
  inputPrefix = &switchD_00794626::switchdataD_009f3924;
  local_470 = (ProgramSources *)dst;
  switch(shaderType) {
  case SHADERTYPE_VERTEX:
    pvVar1 = &shaderSpec->outputs;
    anon_unknown_0::computeFragmentOutputLayout(&outputLayout,pvVar1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"vert",&local_471);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_470,&local_3c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)(local_3a8 + 0x20),"a_",&local_472)
    ;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_3a8,"vtx_out_",&local_461);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
    local_368 = pPVar4;
    std::operator<<((ostream *)&src,"#version 310 es\n");
    if ((shaderSpec->globalDeclarations)._M_string_length != 0) {
      poVar5 = std::operator<<((ostream *)&src,(string *)&shaderSpec->globalDeclarations);
      std::operator<<(poVar5,"\n");
    }
    std::operator<<((ostream *)&src,"layout(location = 0) in highp vec4 a_position;\n");
    iVar8 = 1;
    for (pSVar9 = (shaderSpec->inputs).
                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pSVar9 != (shaderSpec->inputs).
                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pSVar9 = pSVar9 + 1) {
      poVar5 = std::operator<<((ostream *)&src,"layout(location = ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar8);
      poVar5 = std::operator<<(poVar5,") in ");
      std::operator+(&line,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_3a8 + 0x20),&pSVar9->name);
      glu::decl::DeclareVariable::DeclareVariable
                ((DeclareVariable *)&opSrc,&pSVar9->varType,&line,0);
      poVar5 = glu::decl::operator<<(poVar5,(DeclareVariable *)&opSrc);
      std::operator<<(poVar5,";\n");
      glu::decl::DeclareVariable::~DeclareVariable((DeclareVariable *)&opSrc);
      std::__cxx11::string::~string((string *)&line);
      iVar8 = iVar8 + 1;
    }
    iVar8 = 0;
    for (pVVar10 = &((shaderSpec->outputs).
                     super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                     ._M_impl.super__Vector_impl_data._M_start)->varType;
        pSVar9 = (pointer)((long)&pVVar10[-2].m_data + 8),
        pSVar9 != (shaderSpec->outputs).
                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pVVar10 = (VarType *)&pVVar10[2].m_data) {
      DVar3 = (pVVar10->m_data).basic.type;
      if (DVar3 - TYPE_BOOL < 4) {
        iVar2 = glu::getDataTypeScalarSize(DVar3);
        DVar3 = TYPE_INT;
        if (1 < iVar2) {
          DVar3 = glu::getDataTypeIntVec(iVar2);
        }
        glu::VarType::VarType(&intType,DVar3,PRECISION_HIGHP);
        poVar5 = std::operator<<((ostream *)&src,"layout(location = ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar8);
        poVar5 = std::operator<<(poVar5,") flat out ");
        std::operator+(&line,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_3a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pSVar9);
        glu::decl::DeclareVariable::DeclareVariable((DeclareVariable *)&opSrc,&intType,&line,0);
        poVar5 = glu::decl::operator<<(poVar5,(DeclareVariable *)&opSrc);
        std::operator<<(poVar5,";\n");
        glu::decl::DeclareVariable::~DeclareVariable((DeclareVariable *)&opSrc);
        std::__cxx11::string::~string((string *)&line);
        glu::VarType::~VarType(&intType);
      }
      else {
        poVar5 = std::operator<<((ostream *)&src,"layout(location = ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar8);
        poVar5 = std::operator<<(poVar5,") flat out ");
        std::operator+(&line,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_3a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pSVar9);
        glu::decl::DeclareVariable::DeclareVariable((DeclareVariable *)&opSrc,pVVar10,&line,0);
        poVar5 = glu::decl::operator<<(poVar5,(DeclareVariable *)&opSrc);
        std::operator<<(poVar5,";\n");
        glu::decl::DeclareVariable::~DeclareVariable((DeclareVariable *)&opSrc);
        std::__cxx11::string::~string((string *)&line);
      }
      iVar8 = iVar8 + 1;
    }
    poVar5 = std::operator<<((ostream *)&src,"\n");
    poVar5 = std::operator<<(poVar5,"void main (void)\n");
    poVar5 = std::operator<<(poVar5,"{\n");
    poVar5 = std::operator<<(poVar5,"\tgl_Position = a_position;\n");
    std::operator<<(poVar5,"\tgl_PointSize = 1.0;\n");
    for (pSVar9 = (shaderSpec->inputs).
                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pSVar9 != (shaderSpec->inputs).
                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pSVar9 = pSVar9 + 1) {
      poVar5 = std::operator<<((ostream *)&src,"\t");
      glu::decl::DeclareVariable::DeclareVariable
                ((DeclareVariable *)&opSrc,&pSVar9->varType,&pSVar9->name,0);
      poVar5 = glu::decl::operator<<(poVar5,(DeclareVariable *)&opSrc);
      poVar5 = std::operator<<(poVar5," = ");
      poVar5 = std::operator<<(poVar5,(string *)(local_3a8 + 0x20));
      poVar5 = std::operator<<(poVar5,(string *)pSVar9);
      std::operator<<(poVar5,";\n");
      glu::decl::DeclareVariable::~DeclareVariable((DeclareVariable *)&opSrc);
    }
    for (pSVar9 = (pvVar1->
                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pSVar9 != (shaderSpec->outputs).
                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pSVar9 = pSVar9 + 1) {
      poVar5 = std::operator<<((ostream *)&src,"\t");
      glu::decl::DeclareVariable::DeclareVariable
                ((DeclareVariable *)&opSrc,&pSVar9->varType,&pSVar9->name,0);
      poVar5 = glu::decl::operator<<(poVar5,(DeclareVariable *)&opSrc);
      std::operator<<(poVar5,";\n");
      glu::decl::DeclareVariable::~DeclareVariable((DeclareVariable *)&opSrc);
    }
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&opSrc,(string *)&shaderSpec->source,_S_in);
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while (piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)&opSrc,(string *)&line),
          ((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
      poVar5 = std::operator<<((ostream *)&src,"\t");
      poVar5 = std::operator<<(poVar5,(string *)&line);
      std::operator<<(poVar5,"\n");
    }
    std::__cxx11::string::~string((string *)&line);
    std::__cxx11::istringstream::~istringstream((istringstream *)&opSrc);
    for (pSVar9 = (pvVar1->
                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pSVar9 != (shaderSpec->outputs).
                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pSVar9 = pSVar9 + 1) {
      DVar3 = (pSVar9->varType).m_data.basic.type;
      if (DVar3 - TYPE_BOOL < 4) {
        iVar8 = glu::getDataTypeScalarSize(DVar3);
        DVar3 = TYPE_INT;
        if (1 < iVar8) {
          DVar3 = glu::getDataTypeIntVec(iVar8);
        }
        poVar5 = std::operator<<((ostream *)&src,"\t");
        poVar5 = std::operator<<(poVar5,(string *)local_3a8);
        poVar5 = std::operator<<(poVar5,(string *)pSVar9);
        poVar5 = std::operator<<(poVar5," = ");
        pcVar7 = glu::getDataTypeName(DVar3);
        poVar5 = std::operator<<(poVar5,pcVar7);
        poVar5 = std::operator<<(poVar5,"(");
        poVar5 = std::operator<<(poVar5,(string *)pSVar9);
        std::operator<<(poVar5,");\n");
      }
      else {
        poVar5 = std::operator<<((ostream *)&src,"\t");
        poVar5 = std::operator<<(poVar5,(string *)local_3a8);
        poVar5 = std::operator<<(poVar5,(string *)pSVar9);
        poVar5 = std::operator<<(poVar5," = ");
        poVar5 = std::operator<<(poVar5,(string *)pSVar9);
        std::operator<<(poVar5,";\n");
      }
    }
    std::operator<<((ostream *)&src,"}\n");
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
    glu::VertexSource::VertexSource((VertexSource *)local_460,&local_360);
    glu::ProgramSources::operator<<(local_368,(ShaderSource *)local_460);
    std::__cxx11::string::~string((string *)(local_460 + 8));
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)local_3a8);
    std::__cxx11::string::~string((string *)(local_3a8 + 0x20));
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&src,"frag",(allocator<char> *)&local_360);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_470,(string *)&src);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&line,"vtx_out_",(allocator<char> *)(local_3a8 + 0x20));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c8,"o_",(allocator<char> *)local_3a8);
    anon_unknown_0::generatePassthroughFragmentShader
              ((string *)local_460,shaderSpec,(bool)((char)&outputLayout + '\x18'),
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)&line,&local_3c8,in_R9);
    glu::FragmentSource::FragmentSource((FragmentSource *)&opSrc,(string *)local_460);
    glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)&opSrc);
    break;
  case SHADERTYPE_FRAGMENT:
    anon_unknown_0::computeFragmentOutputLayout(&outputLayout,&shaderSpec->outputs);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&src,"vert",(allocator<char> *)&line);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_470,(string *)&src);
    (anonymous_namespace)::generatePassthroughVertexShader_abi_cxx11_
              ((string *)local_460,(_anonymous_namespace_ *)shaderSpec,inputs_00,(char *)inputPrefix
               ,(char *)in_R8);
    glu::VertexSource::VertexSource((VertexSource *)&opSrc,(string *)local_460);
    glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)&opSrc);
    std::__cxx11::string::~string(local_320);
    std::__cxx11::string::~string((string *)local_460);
    std::__cxx11::string::~string((string *)&src);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c8,"frag",(allocator<char> *)&intType);
    local_470 = ::vk::ProgramCollection<glu::ProgramSources>::add
                          ((ProgramCollection<glu::ProgramSources> *)local_470,&local_3c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_3a8 + 0x20),"vtx_out_",&local_471);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_3a8,"o_",&local_472);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
    std::operator<<((ostream *)&src,"#version 310 es\n");
    if ((shaderSpec->globalDeclarations)._M_string_length != 0) {
      poVar5 = std::operator<<((ostream *)&src,(string *)&shaderSpec->globalDeclarations);
      std::operator<<(poVar5,"\n");
    }
    iVar8 = 0;
    for (pSVar9 = (shaderSpec->inputs).
                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pSVar9 != (shaderSpec->inputs).
                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pSVar9 = pSVar9 + 1) {
      poVar5 = std::operator<<((ostream *)&src,"layout(location = ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar8);
      poVar5 = std::operator<<(poVar5,") flat in ");
      std::operator+(&line,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_3a8 + 0x20),&pSVar9->name);
      glu::decl::DeclareVariable::DeclareVariable
                ((DeclareVariable *)&opSrc,&pSVar9->varType,&line,0);
      poVar5 = glu::decl::operator<<(poVar5,(DeclareVariable *)&opSrc);
      std::operator<<(poVar5,";\n");
      glu::decl::DeclareVariable::~DeclareVariable((DeclareVariable *)&opSrc);
      std::__cxx11::string::~string((string *)&line);
      iVar8 = iVar8 + 1;
    }
    anon_unknown_0::generateFragShaderOutputDecl
              ((ostream *)&src,shaderSpec,(bool)((char)&outputLayout + '\x18'),
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)local_3a8,in_R8);
    std::operator<<((ostream *)&src,"\nvoid main (void)\n{\n");
    for (pSVar9 = (shaderSpec->inputs).
                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pSVar9 != (shaderSpec->inputs).
                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pSVar9 = pSVar9 + 1) {
      poVar5 = std::operator<<((ostream *)&src,"\t");
      glu::decl::DeclareVariable::DeclareVariable
                ((DeclareVariable *)&opSrc,&pSVar9->varType,&pSVar9->name,0);
      poVar5 = glu::decl::operator<<(poVar5,(DeclareVariable *)&opSrc);
      poVar5 = std::operator<<(poVar5," = ");
      poVar5 = std::operator<<(poVar5,(string *)(local_3a8 + 0x20));
      poVar5 = std::operator<<(poVar5,(string *)pSVar9);
      std::operator<<(poVar5,";\n");
      glu::decl::DeclareVariable::~DeclareVariable((DeclareVariable *)&opSrc);
    }
    for (pSVar9 = (shaderSpec->outputs).
                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pSVar9 != (shaderSpec->outputs).
                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pSVar9 = pSVar9 + 1) {
      poVar5 = std::operator<<((ostream *)&src,"\t");
      glu::decl::DeclareVariable::DeclareVariable
                ((DeclareVariable *)&opSrc,&pSVar9->varType,&pSVar9->name,0);
      poVar5 = glu::decl::operator<<(poVar5,(DeclareVariable *)&opSrc);
      std::operator<<(poVar5,";\n");
      glu::decl::DeclareVariable::~DeclareVariable((DeclareVariable *)&opSrc);
    }
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&opSrc,(string *)&shaderSpec->source,_S_in);
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while (piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)&opSrc,(string *)&line),
          ((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
      poVar5 = std::operator<<((ostream *)&src,"\t");
      poVar5 = std::operator<<(poVar5,(string *)&line);
      std::operator<<(poVar5,"\n");
    }
    std::__cxx11::string::~string((string *)&line);
    std::__cxx11::istringstream::~istringstream((istringstream *)&opSrc);
    std::__cxx11::string::string<std::allocator<char>>((string *)&opSrc,"",(allocator<char> *)&line)
    ;
    anon_unknown_0::generateFragShaderOutAssign
              ((ostream *)&src,shaderSpec,SUB81(&opSrc,0),(string *)local_3a8,in_R8);
    std::__cxx11::string::~string((string *)&opSrc);
    std::operator<<((ostream *)&src,"}\n");
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
    glu::FragmentSource::FragmentSource((FragmentSource *)local_460,&local_360);
    glu::ProgramSources::operator<<(local_470,(ShaderSource *)local_460);
    std::__cxx11::string::~string((string *)(local_460 + 8));
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)local_3a8);
    std::__cxx11::string::~string((string *)(local_3a8 + 0x20));
    this_01 = &local_3c8;
    goto LAB_0079640b;
  case SHADERTYPE_GEOMETRY:
    pvVar1 = &shaderSpec->outputs;
    anon_unknown_0::computeFragmentOutputLayout(&outputLayout,pvVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&src,"vert",(allocator<char> *)&line);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_470,(string *)&src);
    (anonymous_namespace)::generatePassthroughVertexShader_abi_cxx11_
              ((string *)local_460,(_anonymous_namespace_ *)shaderSpec,inputs,(char *)inputPrefix,
               (char *)in_R8);
    glu::VertexSource::VertexSource((VertexSource *)&opSrc,(string *)local_460);
    glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)&opSrc);
    std::__cxx11::string::~string(local_320);
    std::__cxx11::string::~string((string *)local_460);
    std::__cxx11::string::~string((string *)&src);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"geom",&local_471);
    local_368 = ::vk::ProgramCollection<glu::ProgramSources>::add
                          ((ProgramCollection<glu::ProgramSources> *)local_470,&local_3c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_3a8 + 0x20),"vtx_out_",&local_472);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_3a8,"geom_out_",&local_461);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
    std::operator<<((ostream *)&src,"#version 310 es\n#extension GL_EXT_geometry_shader : require\n"
                   );
    if ((shaderSpec->globalDeclarations)._M_string_length != 0) {
      poVar5 = std::operator<<((ostream *)&src,(string *)&shaderSpec->globalDeclarations);
      std::operator<<(poVar5,"\n");
    }
    poVar5 = std::operator<<((ostream *)&src,"layout(points) in;\n");
    std::operator<<(poVar5,"layout(points, max_vertices = 1) out;\n");
    iVar8 = 0;
    for (pSVar9 = (shaderSpec->inputs).
                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pSVar9 != (shaderSpec->inputs).
                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pSVar9 = pSVar9 + 1) {
      poVar5 = std::operator<<((ostream *)&src,"layout(location = ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar8);
      poVar5 = std::operator<<(poVar5,") flat in ");
      std::operator+(&line,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_3a8 + 0x20),&pSVar9->name);
      glu::decl::DeclareVariable::DeclareVariable
                ((DeclareVariable *)&opSrc,&pSVar9->varType,&line,0);
      poVar5 = glu::decl::operator<<(poVar5,(DeclareVariable *)&opSrc);
      std::operator<<(poVar5,"[];\n");
      glu::decl::DeclareVariable::~DeclareVariable((DeclareVariable *)&opSrc);
      std::__cxx11::string::~string((string *)&line);
      iVar8 = iVar8 + 1;
    }
    iVar8 = 0;
    for (pVVar10 = &((shaderSpec->outputs).
                     super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                     ._M_impl.super__Vector_impl_data._M_start)->varType;
        pSVar9 = (pointer)((long)&pVVar10[-2].m_data + 8),
        pSVar9 != (shaderSpec->outputs).
                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pVVar10 = (VarType *)&pVVar10[2].m_data) {
      DVar3 = (pVVar10->m_data).basic.type;
      if (DVar3 - TYPE_BOOL < 4) {
        iVar2 = glu::getDataTypeScalarSize(DVar3);
        DVar3 = TYPE_INT;
        if (1 < iVar2) {
          DVar3 = glu::getDataTypeIntVec(iVar2);
        }
        glu::VarType::VarType(&intType,DVar3,PRECISION_HIGHP);
        poVar5 = std::operator<<((ostream *)&src,"layout(location = ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar8);
        poVar5 = std::operator<<(poVar5,") flat out ");
        std::operator+(&line,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_3a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pSVar9);
        glu::decl::DeclareVariable::DeclareVariable((DeclareVariable *)&opSrc,&intType,&line,0);
        poVar5 = glu::decl::operator<<(poVar5,(DeclareVariable *)&opSrc);
        std::operator<<(poVar5,";\n");
        glu::decl::DeclareVariable::~DeclareVariable((DeclareVariable *)&opSrc);
        std::__cxx11::string::~string((string *)&line);
        glu::VarType::~VarType(&intType);
      }
      else {
        poVar5 = std::operator<<((ostream *)&src,"layout(location = ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar8);
        poVar5 = std::operator<<(poVar5,") flat out ");
        std::operator+(&line,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_3a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pSVar9);
        glu::decl::DeclareVariable::DeclareVariable((DeclareVariable *)&opSrc,pVVar10,&line,0);
        poVar5 = glu::decl::operator<<(poVar5,(DeclareVariable *)&opSrc);
        std::operator<<(poVar5,";\n");
        glu::decl::DeclareVariable::~DeclareVariable((DeclareVariable *)&opSrc);
        std::__cxx11::string::~string((string *)&line);
      }
      iVar8 = iVar8 + 1;
    }
    poVar5 = std::operator<<((ostream *)&src,"\n");
    poVar5 = std::operator<<(poVar5,"void main (void)\n");
    poVar5 = std::operator<<(poVar5,"{\n");
    std::operator<<(poVar5,"\tgl_Position = gl_in[0].gl_Position;\n\n");
    for (pSVar9 = (shaderSpec->inputs).
                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pSVar9 != (shaderSpec->inputs).
                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pSVar9 = pSVar9 + 1) {
      poVar5 = std::operator<<((ostream *)&src,"\t");
      glu::decl::DeclareVariable::DeclareVariable
                ((DeclareVariable *)&opSrc,&pSVar9->varType,&pSVar9->name,0);
      poVar5 = glu::decl::operator<<(poVar5,(DeclareVariable *)&opSrc);
      poVar5 = std::operator<<(poVar5," = ");
      poVar5 = std::operator<<(poVar5,(string *)(local_3a8 + 0x20));
      poVar5 = std::operator<<(poVar5,(string *)pSVar9);
      std::operator<<(poVar5,"[0];\n");
      glu::decl::DeclareVariable::~DeclareVariable((DeclareVariable *)&opSrc);
    }
    for (pSVar9 = (pvVar1->
                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pSVar9 != (shaderSpec->outputs).
                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pSVar9 = pSVar9 + 1) {
      poVar5 = std::operator<<((ostream *)&src,"\t");
      glu::decl::DeclareVariable::DeclareVariable
                ((DeclareVariable *)&opSrc,&pSVar9->varType,&pSVar9->name,0);
      poVar5 = glu::decl::operator<<(poVar5,(DeclareVariable *)&opSrc);
      std::operator<<(poVar5,";\n");
      glu::decl::DeclareVariable::~DeclareVariable((DeclareVariable *)&opSrc);
    }
    std::operator<<((ostream *)&src,"\n");
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&opSrc,(string *)&shaderSpec->source,_S_in);
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while (piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)&opSrc,(string *)&line),
          ((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
      poVar5 = std::operator<<((ostream *)&src,"\t");
      poVar5 = std::operator<<(poVar5,(string *)&line);
      std::operator<<(poVar5,"\n");
    }
    std::__cxx11::string::~string((string *)&line);
    std::__cxx11::istringstream::~istringstream((istringstream *)&opSrc);
    for (pSVar9 = (pvVar1->
                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pSVar9 != (shaderSpec->outputs).
                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pSVar9 = pSVar9 + 1) {
      DVar3 = (pSVar9->varType).m_data.basic.type;
      if (DVar3 - TYPE_BOOL < 4) {
        iVar8 = glu::getDataTypeScalarSize(DVar3);
        DVar3 = TYPE_INT;
        if (1 < iVar8) {
          DVar3 = glu::getDataTypeIntVec(iVar8);
        }
        poVar5 = std::operator<<((ostream *)&src,"\t");
        poVar5 = std::operator<<(poVar5,(string *)local_3a8);
        poVar5 = std::operator<<(poVar5,(string *)pSVar9);
        poVar5 = std::operator<<(poVar5," = ");
        pcVar7 = glu::getDataTypeName(DVar3);
        poVar5 = std::operator<<(poVar5,pcVar7);
        poVar5 = std::operator<<(poVar5,"(");
        poVar5 = std::operator<<(poVar5,(string *)pSVar9);
        std::operator<<(poVar5,");\n");
      }
      else {
        poVar5 = std::operator<<((ostream *)&src,"\t");
        poVar5 = std::operator<<(poVar5,(string *)local_3a8);
        poVar5 = std::operator<<(poVar5,(string *)pSVar9);
        poVar5 = std::operator<<(poVar5," = ");
        poVar5 = std::operator<<(poVar5,(string *)pSVar9);
        std::operator<<(poVar5,";\n");
      }
    }
    poVar5 = std::operator<<((ostream *)&src,"\tEmitVertex();\n");
    poVar5 = std::operator<<(poVar5,"\tEndPrimitive();\n");
    std::operator<<(poVar5,"}\n");
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
    glu::GeometrySource::GeometrySource((GeometrySource *)local_460,&local_360);
    glu::ProgramSources::operator<<(local_368,(ShaderSource *)local_460);
    std::__cxx11::string::~string((string *)(local_460 + 8));
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)local_3a8);
    std::__cxx11::string::~string((string *)(local_3a8 + 0x20));
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&src,"frag",(allocator<char> *)&local_360);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_470,(string *)&src);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&line,"geom_out_",(allocator<char> *)(local_3a8 + 0x20));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c8,"o_",(allocator<char> *)local_3a8);
    anon_unknown_0::generatePassthroughFragmentShader
              ((string *)local_460,shaderSpec,(bool)((char)&outputLayout + '\x18'),
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)&line,&local_3c8,in_R9);
    glu::FragmentSource::FragmentSource((FragmentSource *)&opSrc,(string *)local_460);
    glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)&opSrc);
    break;
  case SHADERTYPE_TESSELLATION_CONTROL:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&src,"vert",(allocator<char> *)local_460);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_470,(string *)&src);
    (anonymous_namespace)::generateVertexShaderForTess_abi_cxx11_();
    glu::VertexSource::VertexSource((VertexSource *)&opSrc,(string *)&outputLayout);
    glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)&opSrc);
    std::__cxx11::string::~string(local_320);
    std::__cxx11::string::~string((string *)&outputLayout);
    std::__cxx11::string::~string((string *)&src);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&outputLayout,"tess_control",(allocator<char> *)&line);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_470,(string *)&outputLayout)
    ;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&opSrc);
    std::operator<<((ostream *)&opSrc,
                    "#version 310 es\n#extension GL_EXT_tessellation_shader : require\n\n");
    if ((shaderSpec->globalDeclarations)._M_string_length != 0) {
      poVar5 = std::operator<<((ostream *)&opSrc,(string *)&shaderSpec->globalDeclarations);
      std::operator<<(poVar5,"\n");
    }
    std::operator<<((ostream *)&opSrc,"\nlayout(vertices = 1) out;\n\n");
    anon_unknown_0::BufferIoExecutor::declareBufferBlocks((ostream *)&opSrc,shaderSpec);
    std::operator<<((ostream *)&opSrc,"void main (void)\n{\n");
    for (iVar8 = 0; iVar8 != 2; iVar8 = iVar8 + 1) {
      poVar5 = std::operator<<((ostream *)&opSrc,"\tgl_TessLevelInner[");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar8);
      std::operator<<(poVar5,"] = 1.0;\n");
    }
    for (iVar8 = 0; iVar8 != 4; iVar8 = iVar8 + 1) {
      poVar5 = std::operator<<((ostream *)&opSrc,"\tgl_TessLevelOuter[");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar8);
      std::operator<<(poVar5,"] = 1.0;\n");
    }
    poVar5 = std::operator<<((ostream *)&opSrc,"\n");
    std::operator<<(poVar5,"\thighp uint invocationId = uint(gl_PrimitiveID);\n");
    anon_unknown_0::BufferIoExecutor::generateExecBufferIo
              ((ostream *)&opSrc,shaderSpec,"invocationId");
    std::operator<<((ostream *)&opSrc,"}\n");
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&opSrc);
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)&src,(string *)local_460);
    glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)&src);
    std::__cxx11::string::~string(local_1a0);
    std::__cxx11::string::~string((string *)local_460);
    std::__cxx11::string::~string((string *)&outputLayout);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&outputLayout,"tess_eval",(allocator<char> *)&line);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_470,(string *)&outputLayout)
    ;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&opSrc);
    std::operator<<((ostream *)&opSrc,
                    "#version 310 es\n#extension GL_EXT_tessellation_shader : require\n\n");
    std::operator<<((ostream *)&opSrc,"layout(triangles, ccw) in;\n");
    poVar5 = std::operator<<((ostream *)&opSrc,"\nvoid main (void)\n{\n");
    poVar5 = std::operator<<(poVar5,"\tgl_Position = vec4(gl_TessCoord.xy, 0.0, 1.0);\n");
    std::operator<<(poVar5,"}\n");
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&opSrc);
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)&src,(string *)local_460);
    glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)&src);
    std::__cxx11::string::~string(local_1a0);
    std::__cxx11::string::~string((string *)local_460);
    std::__cxx11::string::~string((string *)&outputLayout);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&src,"frag",(allocator<char> *)local_460);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_470,(string *)&src);
    (anonymous_namespace)::generateEmptyFragmentSource_abi_cxx11_();
    glu::FragmentSource::FragmentSource((FragmentSource *)&opSrc,(string *)&outputLayout);
    glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)&opSrc);
    goto LAB_007954e8;
  case SHADERTYPE_TESSELLATION_EVALUATION:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&src,"vert",(allocator<char> *)local_460);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_470,(string *)&src);
    (anonymous_namespace)::generateVertexShaderForTess_abi_cxx11_();
    glu::VertexSource::VertexSource((VertexSource *)&opSrc,(string *)&outputLayout);
    glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)&opSrc);
    std::__cxx11::string::~string(local_320);
    std::__cxx11::string::~string((string *)&outputLayout);
    std::__cxx11::string::~string((string *)&src);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&outputLayout,"tess_control",(allocator<char> *)&line);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_470,(string *)&outputLayout)
    ;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&opSrc);
    std::operator<<((ostream *)&opSrc,
                    "#version 310 es\n#extension GL_EXT_tessellation_shader : require\n\n");
    std::operator<<((ostream *)&opSrc,"layout(vertices = 1) out;\n\n");
    std::operator<<((ostream *)&opSrc,"void main (void)\n{\n");
    for (iVar8 = 0; iVar8 != 2; iVar8 = iVar8 + 1) {
      poVar5 = std::operator<<((ostream *)&opSrc,"\tgl_TessLevelInner[");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar8);
      std::operator<<(poVar5,"] = 1.0;\n");
    }
    for (iVar8 = 0; iVar8 != 4; iVar8 = iVar8 + 1) {
      poVar5 = std::operator<<((ostream *)&opSrc,"\tgl_TessLevelOuter[");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar8);
      std::operator<<(poVar5,"] = 1.0;\n");
    }
    std::operator<<((ostream *)&opSrc,"}\n");
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&opSrc);
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)&src,(string *)local_460);
    glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)&src);
    std::__cxx11::string::~string(local_1a0);
    std::__cxx11::string::~string((string *)local_460);
    std::__cxx11::string::~string((string *)&outputLayout);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&outputLayout,"tess_eval",(allocator<char> *)&line);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_470,(string *)&outputLayout)
    ;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&opSrc);
    std::operator<<((ostream *)&opSrc,
                    "#version 310 es\n#extension GL_EXT_tessellation_shader : require\n\n");
    if ((shaderSpec->globalDeclarations)._M_string_length != 0) {
      poVar5 = std::operator<<((ostream *)&opSrc,(string *)&shaderSpec->globalDeclarations);
      std::operator<<(poVar5,"\n");
    }
    std::operator<<((ostream *)&opSrc,"\n");
    std::operator<<((ostream *)&opSrc,"layout(isolines, equal_spacing) in;\n\n");
    anon_unknown_0::BufferIoExecutor::declareBufferBlocks((ostream *)&opSrc,shaderSpec);
    poVar5 = std::operator<<((ostream *)&opSrc,"void main (void)\n{\n");
    poVar5 = std::operator<<(poVar5,"\tgl_Position = vec4(gl_TessCoord.x, 0.0, 0.0, 1.0);\n");
    std::operator<<(poVar5,
                    "\thighp uint invocationId = uint(gl_PrimitiveID)*2u + (gl_TessCoord.x > 0.5 ? 1u : 0u);\n"
                   );
    anon_unknown_0::BufferIoExecutor::generateExecBufferIo
              ((ostream *)&opSrc,shaderSpec,"invocationId");
    std::operator<<((ostream *)&opSrc,"}\n");
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&opSrc);
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)&src,(string *)local_460);
    glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)&src);
    std::__cxx11::string::~string(local_1a0);
    std::__cxx11::string::~string((string *)local_460);
    std::__cxx11::string::~string((string *)&outputLayout);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&src,"frag",(allocator<char> *)local_460);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_470,(string *)&src);
    (anonymous_namespace)::generateEmptyFragmentSource_abi_cxx11_();
    glu::FragmentSource::FragmentSource((FragmentSource *)&opSrc,(string *)&outputLayout);
    glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)&opSrc);
LAB_007954e8:
    std::__cxx11::string::~string(local_320);
    std::__cxx11::string::~string((string *)&outputLayout);
    this_00 = (FragmentOutputLayout *)&src;
LAB_00795507:
    std::__cxx11::string::~string((string *)this_00);
    return;
  case SHADERTYPE_COMPUTE:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&outputLayout,"compute",(allocator<char> *)&line);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_470,(string *)&outputLayout)
    ;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&opSrc);
    std::operator<<((ostream *)&opSrc,"#version 310 es\n");
    if ((shaderSpec->globalDeclarations)._M_string_length != 0) {
      poVar5 = std::operator<<((ostream *)&opSrc,(string *)&shaderSpec->globalDeclarations);
      std::operator<<(poVar5,"\n");
    }
    poVar5 = std::operator<<((ostream *)&opSrc,"layout(local_size_x = 1) in;\n");
    std::operator<<(poVar5,"\n");
    anon_unknown_0::BufferIoExecutor::declareBufferBlocks((ostream *)&opSrc,shaderSpec);
    poVar5 = std::operator<<((ostream *)&opSrc,"void main (void)\n");
    poVar5 = std::operator<<(poVar5,"{\n");
    poVar5 = std::operator<<(poVar5,
                             "\tuint invocationNdx = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z\n"
                            );
    std::operator<<(poVar5,
                    "\t                   + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
                   );
    anon_unknown_0::BufferIoExecutor::generateExecBufferIo
              ((ostream *)&opSrc,shaderSpec,"invocationNdx");
    std::operator<<((ostream *)&opSrc,"}\n");
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&opSrc);
    glu::ComputeSource::ComputeSource((ComputeSource *)&src,(string *)local_460);
    glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)&src);
    std::__cxx11::string::~string(local_1a0);
    std::__cxx11::string::~string((string *)local_460);
    this_00 = &outputLayout;
    goto LAB_00795507;
  default:
    this = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this,"Unsupported shader type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderexecutor/vktShaderExecutor.cpp"
               ,0xb2b);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::~string(local_320);
  std::__cxx11::string::~string((string *)local_460);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&line);
  this_01 = (string *)&src;
LAB_0079640b:
  std::__cxx11::string::~string((string *)this_01);
  anon_unknown_0::FragmentOutputLayout::~FragmentOutputLayout(&outputLayout);
  return;
}

Assistant:

void generateSources (glu::ShaderType shaderType, const ShaderSpec& shaderSpec, vk::SourceCollections& dst)
{
	switch (shaderType)
	{
		case glu::SHADERTYPE_VERTEX:					VertexShaderExecutor::generateSources	(shaderSpec, dst);	break;
		case glu::SHADERTYPE_TESSELLATION_CONTROL:		TessControlExecutor::generateSources	(shaderSpec, dst);	break;
		case glu::SHADERTYPE_TESSELLATION_EVALUATION:	TessEvaluationExecutor::generateSources	(shaderSpec, dst);	break;
		case glu::SHADERTYPE_GEOMETRY:					GeometryShaderExecutor::generateSources	(shaderSpec, dst);	break;
		case glu::SHADERTYPE_FRAGMENT:					FragmentShaderExecutor::generateSources	(shaderSpec, dst);	break;
		case glu::SHADERTYPE_COMPUTE:					ComputeShaderExecutor::generateSources	(shaderSpec, dst);	break;
		default:
			TCU_THROW(InternalError, "Unsupported shader type");
	}
}